

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

void Abc_BufAddToQue(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  Vec_Que_t *pVVar2;
  float *pfVar3;
  int *piVar4;
  bool bVar5;
  bool bVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  size_t sVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  iVar12 = (pObj->vFanouts).nSize;
  if ((p->nFanMin <= iVar12) &&
     ((p->fBufPis != 0 || ((uVar8 = *(uint *)&pObj->field_0x14 & 0xf, uVar8 != 2 && (uVar8 != 5)))))
     ) {
    iVar1 = pObj->Id;
    lVar17 = (long)iVar1;
    if ((lVar17 < 0) || (p->vCounts->nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                    ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
    }
    p->vCounts->pArray[lVar17] = (float)iVar12;
    pVVar2 = p->vQue;
    iVar12 = pVVar2->nCap;
    if ((iVar1 < iVar12) && (-1 < pVVar2->pOrder[lVar17])) {
      pfVar3 = *pVVar2->pCostsFlt;
      if (pfVar3 == (float *)0x0) {
        fVar18 = (float)iVar1;
      }
      else {
        fVar18 = pfVar3[lVar17];
      }
      piVar7 = pVVar2->pOrder;
      uVar8 = piVar7[lVar17];
      uVar13 = (ulong)(int)uVar8;
      if (uVar13 == 0xffffffffffffffff) {
LAB_00453c8f:
        __assert_fail("p->pOrder[v] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      piVar4 = pVVar2->pHeap;
      if (piVar4[uVar13] != iVar1) {
LAB_00453cae:
        __assert_fail("p->pHeap[i] == v",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      bVar5 = true;
      if (1 < (int)uVar8) {
        uVar14 = uVar13;
        uVar13 = (ulong)uVar8;
        bVar6 = false;
        do {
          bVar5 = bVar6;
          uVar13 = uVar13 >> 1;
          iVar12 = piVar4[uVar13];
          if (pfVar3 == (float *)0x0) {
            fVar19 = (float)iVar12;
          }
          else {
            fVar19 = pfVar3[iVar12];
          }
          uVar8 = (uint)uVar14;
          if (fVar18 <= fVar19) {
            uVar13 = uVar14 & 0xffffffff;
            break;
          }
          piVar4[uVar14 & 0xffffffff] = iVar12;
          piVar7[iVar12] = uVar8;
          bVar5 = true;
          uVar14 = uVar13;
          bVar6 = true;
        } while (3 < uVar8);
        bVar5 = !bVar5;
      }
      iVar12 = (int)uVar13;
      piVar4[iVar12] = iVar1;
      piVar7[lVar17] = iVar12;
      if (bVar5) {
        if (pfVar3 == (float *)0x0) {
          fVar18 = (float)iVar1;
        }
        else {
          fVar18 = pfVar3[lVar17];
        }
        uVar8 = iVar12 * 2;
        iVar15 = pVVar2->nSize;
        if ((int)uVar8 < iVar15) {
          do {
            iVar12 = (int)uVar13;
            uVar16 = uVar8 | 1;
            if ((int)uVar16 < iVar15) {
              if (pfVar3 == (float *)0x0) {
                fVar19 = (float)piVar4[(int)uVar8];
              }
              else {
                fVar19 = pfVar3[piVar4[(int)uVar8]];
              }
              if (pfVar3 == (float *)0x0) {
                fVar20 = (float)piVar4[(int)uVar16];
              }
              else {
                fVar20 = pfVar3[piVar4[(int)uVar16]];
              }
              uVar13 = (ulong)uVar8;
              if (fVar19 < fVar20) {
                uVar13 = (ulong)uVar16;
              }
            }
            else {
              uVar13 = (ulong)uVar8;
            }
            iVar11 = (int)uVar13;
            if (iVar15 <= iVar11) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar15 = piVar4[iVar11];
            if (pfVar3 == (float *)0x0) {
              fVar19 = (float)iVar15;
            }
            else {
              fVar19 = pfVar3[iVar15];
            }
            if (fVar19 <= fVar18) break;
            piVar4[iVar12] = iVar15;
            piVar7[iVar15] = iVar12;
            uVar8 = iVar11 * 2;
            iVar15 = pVVar2->nSize;
            iVar12 = iVar11;
          } while ((int)uVar8 < iVar15);
        }
        piVar4[iVar12] = iVar1;
        piVar7[lVar17] = iVar12;
      }
    }
    else {
      if (iVar12 <= pVVar2->nSize) {
        iVar11 = pVVar2->nSize + 1;
        iVar15 = iVar12 * 2;
        if (iVar11 == iVar15 || SBORROW4(iVar11,iVar15) != iVar11 + iVar12 * -2 < 0) {
          iVar11 = iVar15;
        }
        if (iVar12 < iVar11) {
          lVar9 = (long)iVar11;
          sVar10 = lVar9 * 4;
          if (pVVar2->pHeap == (int *)0x0) {
            piVar7 = (int *)malloc(sVar10);
          }
          else {
            piVar7 = (int *)realloc(pVVar2->pHeap,sVar10);
          }
          pVVar2->pHeap = piVar7;
          if (pVVar2->pOrder == (int *)0x0) {
            piVar7 = (int *)malloc(sVar10);
          }
          else {
            piVar7 = (int *)realloc(pVVar2->pOrder,sVar10);
          }
          pVVar2->pOrder = piVar7;
          memset(pVVar2->pHeap + pVVar2->nCap,0xff,(lVar9 - pVVar2->nCap) * 4);
          memset(pVVar2->pOrder + pVVar2->nCap,0xff,(lVar9 - pVVar2->nCap) * 4);
          pVVar2->nCap = iVar11;
        }
      }
      iVar12 = pVVar2->nCap;
      if (iVar12 <= iVar1) {
        uVar16 = iVar1 + 1;
        uVar8 = iVar12 * 2;
        if (uVar16 != uVar8 && SBORROW4(uVar16,uVar8) == (int)(uVar16 + iVar12 * -2) < 0) {
          uVar8 = uVar16;
        }
        if (iVar12 < (int)uVar8) {
          sVar10 = (ulong)uVar8 * 4;
          if (pVVar2->pHeap == (int *)0x0) {
            piVar7 = (int *)malloc(sVar10);
          }
          else {
            piVar7 = (int *)realloc(pVVar2->pHeap,sVar10);
          }
          pVVar2->pHeap = piVar7;
          sVar10 = (ulong)uVar8 << 2;
          if (pVVar2->pOrder == (int *)0x0) {
            piVar7 = (int *)malloc(sVar10);
          }
          else {
            piVar7 = (int *)realloc(pVVar2->pOrder,sVar10);
          }
          pVVar2->pOrder = piVar7;
          memset(pVVar2->pHeap + pVVar2->nCap,0xff,((long)(int)uVar8 - (long)pVVar2->nCap) * 4);
          memset(pVVar2->pOrder + pVVar2->nCap,0xff,((long)(int)uVar8 - (long)pVVar2->nCap) * 4);
          pVVar2->nCap = uVar8;
        }
      }
      iVar12 = pVVar2->nSize;
      if (pVVar2->nCap <= iVar12) {
        __assert_fail("p->nSize < p->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar7 = pVVar2->pOrder;
      if (piVar7[lVar17] != -1) {
        __assert_fail("p->pOrder[v] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar4 = pVVar2->pHeap;
      if (piVar4[iVar12] != -1) {
        __assert_fail("p->pHeap[p->nSize] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar7[lVar17] = iVar12;
      iVar12 = pVVar2->nSize;
      pVVar2->nSize = iVar12 + 1;
      piVar4[iVar12] = iVar1;
      pfVar3 = *pVVar2->pCostsFlt;
      if (pfVar3 == (float *)0x0) {
        fVar18 = (float)iVar1;
      }
      else {
        fVar18 = pfVar3[lVar17];
      }
      uVar8 = piVar7[lVar17];
      uVar13 = (ulong)(int)uVar8;
      if (uVar13 == 0xffffffffffffffff) goto LAB_00453c8f;
      if (piVar4[uVar13] != iVar1) goto LAB_00453cae;
      if (1 < (int)uVar8) {
        uVar14 = (ulong)uVar8;
        do {
          uVar16 = (uint)uVar13;
          uVar14 = uVar14 >> 1;
          iVar12 = piVar4[uVar14];
          if (pfVar3 == (float *)0x0) {
            fVar19 = (float)iVar12;
          }
          else {
            fVar19 = pfVar3[iVar12];
          }
          uVar8 = uVar16;
          if (fVar18 <= fVar19) break;
          piVar4[uVar13 & 0xffffffff] = iVar12;
          piVar7[iVar12] = uVar16;
          uVar13 = uVar14;
          uVar8 = (uint)uVar14;
        } while (3 < uVar16);
      }
      piVar4[(int)uVar8] = iVar1;
      piVar7[lVar17] = uVar8;
    }
  }
  return;
}

Assistant:

void Abc_BufAddToQue( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    if ( Abc_ObjFanoutNum(pObj) < p->nFanMin || (!p->fBufPis && Abc_ObjIsCi(pObj)) )
        return;
    Vec_FltWriteEntry( p->vCounts, Abc_ObjId(pObj), Abc_ObjFanoutNum(pObj) );
    if ( Vec_QueIsMember(p->vQue, Abc_ObjId(pObj)) )
        Vec_QueUpdate( p->vQue, Abc_ObjId(pObj) );
    else
        Vec_QuePush( p->vQue, Abc_ObjId(pObj) );
}